

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O1

void __thiscall
FIX::double_conversion::FillFractionals
          (double_conversion *this,uint64_t fractionals,int exponent,int fractional_count,
          Vector<char> buffer,int *length,int *decimal_point)

{
  int iVar1;
  int iVar2;
  UInt128 *pUVar3;
  int iVar4;
  undefined4 in_register_0000000c;
  double_conversion *this_00;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  int *decimal_point_00;
  int *piVar8;
  byte bVar9;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  UInt128 local_48;
  int *local_38;
  
  this_00 = (double_conversion *)CONCAT44(in_register_0000000c,fractional_count);
  piVar8 = buffer._8_8_;
  decimal_point_00 = (int *)buffer.start_;
  pcVar6 = (char *)((ulong)decimal_point_00 & 0xffffffff);
  iVar4 = (int)fractionals;
  if (iVar4 < -0x40) {
    local_38 = length;
    local_48.low_bits_ = 0;
    local_48.high_bits_ = (uint64_t)this;
    UInt128::Shift(&local_48,-0x40 - iVar4);
    if (exponent < 1) {
      iVar4 = 0x80;
    }
    else {
      iVar5 = -0x3f;
      iVar2 = 0x80;
      do {
        iVar4 = iVar2;
        if (local_48.low_bits_ == 0 &&
            (double_conversion *)local_48.high_bits_ == (double_conversion *)0x0) break;
        UInt128::Multiply(&local_48,5);
        iVar4 = iVar2 + -1;
        if (iVar2 < 0x41) {
          uVar7 = local_48.low_bits_ >> ((byte)iVar4 & 0x3f);
          iVar2 = (int)(local_48.high_bits_ << ((byte)iVar5 & 0x3f)) + (int)uVar7;
          local_48.high_bits_ = 0;
          local_48.low_bits_ = local_48.low_bits_ - (uVar7 << ((byte)iVar4 & 0x3f));
        }
        else {
          bVar9 = (char)iVar2 + 0xbf;
          iVar2 = (int)(local_48.high_bits_ >> (bVar9 & 0x3f));
          local_48.high_bits_ = (uint64_t)(local_48.high_bits_ + -((long)iVar2 << (bVar9 & 0x3f)));
        }
        if (9 < iVar2) {
          __assert_fail("digit <= 9",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fixed-dtoa.cc"
                        ,0x116,
                        "void FIX::double_conversion::FillFractionals(uint64_t, int, int, Vector<char>, int *, int *)"
                       );
        }
        iVar1 = *piVar8;
        if (((long)iVar1 < 0) || ((int)buffer.start_ <= iVar1)) goto LAB_0016f367;
        this_00[iVar1] = (double_conversion)((char)iVar2 + '0');
        *piVar8 = *piVar8 + 1;
        iVar1 = iVar5 - exponent;
        iVar5 = iVar5 + 1;
        iVar2 = iVar4;
      } while (iVar1 != -0x40);
    }
    pUVar3 = (UInt128 *)&local_48.low_bits_;
    if (0x40 < iVar4) {
      pUVar3 = &local_48;
    }
    if ((pUVar3->high_bits_ >> ((ulong)(iVar4 - 1) & 0x3f) & 1) != 0) {
      buffer_01._8_8_ = piVar8;
      buffer_01.start_ = pcVar6;
      RoundUp(this_00,buffer_01,local_38,decimal_point_00);
    }
  }
  else {
    if ((ulong)this >> 0x38 != 0) {
      __assert_fail("fractionals >> 56 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fixed-dtoa.cc"
                    ,0xef,
                    "void FIX::double_conversion::FillFractionals(uint64_t, int, int, Vector<char>, int *, int *)"
                   );
    }
    iVar4 = -iVar4;
    bVar9 = (byte)iVar4;
    if (this != (double_conversion *)0x0 && 0 < exponent) {
      iVar2 = 1;
      do {
        iVar4 = iVar4 + -1;
        bVar9 = (byte)iVar4;
        iVar5 = (int)((ulong)((long)this * 5) >> (bVar9 & 0x3f));
        if (9 < iVar5) {
          __assert_fail("digit <= 9",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fixed-dtoa.cc"
                        ,0x100,
                        "void FIX::double_conversion::FillFractionals(uint64_t, int, int, Vector<char>, int *, int *)"
                       );
        }
        iVar1 = *piVar8;
        if (((long)iVar1 < 0) || ((int)buffer.start_ <= iVar1)) {
LAB_0016f367:
          __assert_fail("0 <= index && index < length_",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                        ,0xcc,
                        "T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]")
          ;
        }
        decimal_point_00 = (int *)(ulong)(iVar5 + 0x30U);
        this_00[iVar1] = SUB41(iVar5 + 0x30U,0);
        *piVar8 = *piVar8 + 1;
        this = (double_conversion *)((long)this * 5 - ((long)iVar5 << (bVar9 & 0x3f)));
      } while ((iVar2 < exponent) && (iVar2 = iVar2 + 1, this != (double_conversion *)0x0));
    }
    if (((ulong)this >> ((ulong)(byte)(bVar9 - 1) & 0x3f) & 1) != 0) {
      buffer_00._8_8_ = piVar8;
      buffer_00.start_ = pcVar6;
      RoundUp(this_00,buffer_00,length,decimal_point_00);
      return;
    }
  }
  return;
}

Assistant:

static void FillFractionals(uint64_t fractionals, int exponent,
                            int fractional_count, Vector<char> buffer,
                            int* length, int* decimal_point) {
  ASSERT(-128 <= exponent && exponent <= 0);
  // 'fractionals' is a fixed-point number, with binary point at bit
  // (-exponent). Inside the function the non-converted remainder of fractionals
  // is a fixed-point number, with binary point at bit 'point'.
  if (-exponent <= 64) {
    // One 64 bit number is sufficient.
    ASSERT(fractionals >> 56 == 0);
    int point = -exponent;
    for (int i = 0; i < fractional_count; ++i) {
      if (fractionals == 0) break;
      // Instead of multiplying by 10 we multiply by 5 and adjust the point
      // location. This way the fractionals variable will not overflow.
      // Invariant at the beginning of the loop: fractionals < 2^point.
      // Initially we have: point <= 64 and fractionals < 2^56
      // After each iteration the point is decremented by one.
      // Note that 5^3 = 125 < 128 = 2^7.
      // Therefore three iterations of this loop will not overflow fractionals
      // (even without the subtraction at the end of the loop body). At this
      // time point will satisfy point <= 61 and therefore fractionals < 2^point
      // and any further multiplication of fractionals by 5 will not overflow.
      fractionals *= 5;
      point--;
      int digit = static_cast<int>(fractionals >> point);
      ASSERT(digit <= 9);
      buffer[*length] = static_cast<char>('0' + digit);
      (*length)++;
      fractionals -= static_cast<uint64_t>(digit) << point;
    }
    // If the first bit after the point is set we have to round up.
    if (((fractionals >> (point - 1)) & 1) == 1) {
      RoundUp(buffer, length, decimal_point);
    }
  } else {  // We need 128 bits.
    ASSERT(64 < -exponent && -exponent <= 128);
    UInt128 fractionals128 = UInt128(fractionals, 0);
    fractionals128.Shift(-exponent - 64);
    int point = 128;
    for (int i = 0; i < fractional_count; ++i) {
      if (fractionals128.IsZero()) break;
      // As before: instead of multiplying by 10 we multiply by 5 and adjust the
      // point location.
      // This multiplication will not overflow for the same reasons as before.
      fractionals128.Multiply(5);
      point--;
      int digit = fractionals128.DivModPowerOf2(point);
      ASSERT(digit <= 9);
      buffer[*length] = static_cast<char>('0' + digit);
      (*length)++;
    }
    if (fractionals128.BitAt(point - 1) == 1) {
      RoundUp(buffer, length, decimal_point);
    }
  }
}